

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_inverse_scalar(secp256k1_scalar *out,secp256k1_scalar *x,int var)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  uint extraout_EAX;
  uint32_t uVar4;
  long *extraout_RDX;
  long lVar5;
  long lVar6;
  secp256k1_scalar *r_00;
  secp256k1_scalar *psVar7;
  uchar *__s;
  size_t count;
  code *pcVar8;
  uint extraout_XMM0_Da;
  uint uVar9;
  uint extraout_XMM0_Db;
  uint uVar10;
  uint extraout_XMM0_Dc;
  uint uVar11;
  uint extraout_XMM0_Dd;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  secp256k1_scalar l;
  secp256k1_scalar r;
  secp256k1_scalar t;
  ulong uStack_1140;
  secp256k1_scalar *psStack_1138;
  uchar auStack_1130 [4232];
  secp256k1_scalar *psStack_a8;
  secp256k1_scalar local_78;
  secp256k1_scalar local_58;
  secp256k1_scalar local_38;
  
  r_00 = &local_78;
  psVar7 = &local_78;
  pcVar8 = secp256k1_scalar_inverse_var;
  if (var == 0) {
    pcVar8 = secp256k1_scalar_inverse;
  }
  uVar1 = (*pcVar8)();
  if (out != (secp256k1_scalar *)0x0) {
    out->d[2] = CONCAT44(local_78.d[2]._4_4_,(uint)local_78.d[2]);
    out->d[3] = CONCAT44(local_78.d[3]._4_4_,(uint)local_78.d[3]);
    out->d[0] = CONCAT44(local_78.d[0]._4_4_,(uint)local_78.d[0]);
    out->d[1] = CONCAT44(local_78.d[1]._4_4_,(uint)local_78.d[1]);
  }
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  auVar13._0_4_ = -(uint)((int)x->d[2] == 0 && (int)x->d[0] == 0);
  auVar13._4_4_ = -(uint)(*(int *)((long)x->d + 0x14) == 0 && *(int *)((long)x->d + 4) == 0);
  auVar13._8_4_ = -(uint)((int)x->d[3] == 0 && (int)x->d[1] == 0);
  auVar13._12_4_ = -(uint)(*(int *)((long)x->d + 0x1c) == 0 && *(int *)((long)x->d + 0xc) == 0);
  uVar2 = movmskps(uVar1,auVar13);
  uVar2 = uVar2 ^ 0xf;
  if (uVar2 != 0) {
    r_00 = &local_38;
    secp256k1_scalar_mul(r_00,x,&local_78);
    if (((local_38.d[0] != 1 || local_38.d[1] != 0) || local_38.d[2] != 0) || local_38.d[3] != 0) {
      test_inverse_scalar_cold_1();
      goto LAB_0016175c;
    }
    iVar3 = secp256k1_scalar_add(&local_58,x,&scalar_minus_one);
    auVar14._0_4_ = -(uint)((int)local_58.d[2] == 0 && (int)local_58.d[0] == 0);
    auVar14._4_4_ = -(uint)(local_58.d[2]._4_4_ == 0 && local_58.d[0]._4_4_ == 0);
    auVar14._8_4_ = -(uint)((int)local_58.d[3] == 0 && (int)local_58.d[1] == 0);
    auVar14._12_4_ = -(uint)(local_58.d[3]._4_4_ == 0 && local_58.d[1]._4_4_ == 0);
    iVar3 = movmskps(iVar3,auVar14);
    if (iVar3 == 0xf) {
      return;
    }
    x = &local_58;
    (*pcVar8)(x,x);
    secp256k1_scalar_add(&local_78,&scalar_minus_one,&local_78);
    (*pcVar8)(&local_78,&local_78);
    secp256k1_scalar_add(&local_78,&local_78,&secp256k1_scalar_one);
    iVar3 = secp256k1_scalar_add(&local_78,x,&local_78);
    auVar15._0_4_ = -(uint)((uint)local_78.d[2] == 0 && (uint)local_78.d[0] == 0);
    auVar15._4_4_ = -(uint)(local_78.d[2]._4_4_ == 0 && local_78.d[0]._4_4_ == 0);
    auVar15._8_4_ = -(uint)((uint)local_78.d[3] == 0 && (uint)local_78.d[1] == 0);
    auVar15._12_4_ = -(uint)(local_78.d[3]._4_4_ == 0 && local_78.d[1]._4_4_ == 0);
    iVar3 = movmskps(iVar3,auVar15);
    if (iVar3 == 0xf) {
      return;
    }
    test_inverse_scalar_cold_2();
    r_00 = psVar7;
    uVar2 = extraout_EAX;
    uVar9 = extraout_XMM0_Da;
    uVar10 = extraout_XMM0_Db;
    uVar11 = extraout_XMM0_Dc;
    uVar12 = extraout_XMM0_Dd;
  }
  auVar16._0_4_ = -(uint)(((uint)local_78.d[2] | (uint)local_78.d[0]) == uVar9);
  auVar16._4_4_ = -(uint)((local_78.d[2]._4_4_ | local_78.d[0]._4_4_) == uVar10);
  auVar16._8_4_ = -(uint)(((uint)local_78.d[3] | (uint)local_78.d[1]) == uVar11);
  auVar16._12_4_ = -(uint)((local_78.d[3]._4_4_ | local_78.d[1]._4_4_) == uVar12);
  iVar3 = movmskps(uVar2,auVar16);
  if (iVar3 == 0xf) {
    return;
  }
LAB_0016175c:
  test_inverse_scalar_cold_3();
  __s = auStack_1130;
  psStack_a8 = x;
  memset(__s,0,0x1081);
  uStack_1140 = 0;
  lVar6 = 0x41;
  psStack_1138 = r_00;
  secp256k1_hsort(__s,0x41,(size_t)r_00,test_hsort_cmp,&uStack_1140);
  if (0x3f < uStack_1140) {
    test_hsort_is_sorted(auStack_1130,0x41,(size_t)r_00);
    if (0 < COUNT) {
      iVar3 = 0;
      do {
        uVar4 = testrand_int(0x41);
        count = (size_t)(int)uVar4;
        testrand_bytes_test(auStack_1130,count * (long)r_00);
        secp256k1_hsort(auStack_1130,count,(size_t)r_00,test_hsort_cmp,&uStack_1140);
        test_hsort_is_sorted(auStack_1130,count,(size_t)r_00);
        iVar3 = iVar3 + 1;
      } while (iVar3 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX = *extraout_RDX + 1;
  if (extraout_RDX[1] != 0) {
    lVar5 = 0;
    do {
      if (__s[lVar5] != *(uchar *)(lVar6 + lVar5)) {
        return;
      }
      lVar5 = lVar5 + 1;
    } while (extraout_RDX[1] != lVar5);
  }
  return;
}

Assistant:

static void test_inverse_scalar(secp256k1_scalar* out, const secp256k1_scalar* x, int var)
{
    secp256k1_scalar l, r, t;

    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&l, x);  /* l = 1/x */
    if (out) *out = l;
    if (secp256k1_scalar_is_zero(x)) {
        CHECK(secp256k1_scalar_is_zero(&l));
        return;
    }
    secp256k1_scalar_mul(&t, x, &l);                                             /* t = x*(1/x) */
    CHECK(secp256k1_scalar_is_one(&t));                                          /* x*(1/x) == 1 */
    secp256k1_scalar_add(&r, x, &scalar_minus_one);                              /* r = x-1 */
    if (secp256k1_scalar_is_zero(&r)) return;
    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&r, &r); /* r = 1/(x-1) */
    secp256k1_scalar_add(&l, &scalar_minus_one, &l);                             /* l = 1/x-1 */
    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&l, &l); /* l = 1/(1/x-1) */
    secp256k1_scalar_add(&l, &l, &secp256k1_scalar_one);                         /* l = 1/(1/x-1)+1 */
    secp256k1_scalar_add(&l, &r, &l);                                            /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_scalar_is_zero(&l));                                         /* l == 0 */
}